

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_int,int>::
Flush<duckdb::BitpackingCompressionState<unsigned_int,true,int>::BitpackingWriter>
          (BitpackingState<unsigned_int,int> *this)

{
  BitpackingState<unsigned_int,int> *values;
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  idx_t iVar5;
  uint *values_00;
  int iVar6;
  BitpackingState<unsigned_int,int> BVar7;
  unsigned_long uVar8;
  uint value_1;
  idx_t iVar9;
  bool bVar10;
  uint value;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  
  bVar10 = true;
  if (*(idx_t *)(this + 0x4810) != 0) {
    if (((this[0x4845] == (BitpackingState<unsigned_int,int>)0x0) &&
        (*(int *)(this + 0x482c) != *(int *)(this + 0x4828))) ||
       (1 < (byte)((char)this[0x4848] - 1U))) {
      BVar7 = (BitpackingState<unsigned_int,int>)
              TrySubtractOperator::Operation<unsigned_int,unsigned_int,unsigned_int>
                        (*(uint32_t *)(this + 0x482c),*(uint32_t *)(this + 0x4828),
                         (uint32_t *)(this + 0x4830));
      this[0x4847] = BVar7;
      BitpackingState<unsigned_int,_int>::CalculateDeltaStats
                ((BitpackingState<unsigned_int,_int> *)this);
      if (this[0x4846] == (BitpackingState<unsigned_int,int>)0x1) {
        iVar2 = *(int *)(this + 0x4834);
        if ((*(int *)(this + 0x4838) == iVar2) && (((byte)this[0x4848] & 0xfe) != 4)) {
          BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteConstantDelta
                    (*(int *)(this + 0x4838),**(uint **)(this + 0x2008),*(idx_t *)(this + 0x4810),
                     *(uint **)(this + 0x2008),(bool *)(this + 0x4010),*(void **)(this + 0x4820));
          *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 0xc;
          return true;
        }
        uVar3 = *(uint *)(this + 0x4830);
        uVar4 = *(uint *)(this + 0x483c);
        iVar6 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        bVar12 = 0x20 - ((byte)iVar6 ^ 0x1f);
        if (0xfffffff < uVar4) {
          bVar12 = 0x20;
        }
        if (uVar4 == 0) {
          bVar12 = 0;
        }
        iVar6 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        bVar11 = 0x20 - ((byte)iVar6 ^ 0x1f);
        if (0xfffffff < uVar3) {
          bVar11 = 0x20;
        }
        BVar7 = this[0x4848];
        if ((BVar7 != (BitpackingState<unsigned_int,int>)0x5 && uVar3 != 0) && bVar12 < bVar11) {
          values = this + 0x2010;
          iVar5 = *(idx_t *)(this + 0x4810);
          if (iVar5 != 0) {
            iVar9 = 0;
            do {
              *(int *)(values + iVar9 * 4) = *(int *)(values + iVar9 * 4) - iVar2;
              iVar9 = iVar9 + 1;
            } while (iVar5 != iVar9);
          }
          BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteDeltaFor
                    ((uint *)values,(bool *)(this + 0x4010),bVar12,*(uint *)(this + 0x4834),
                     *(int *)(this + 0x4840),*(uint **)(this + 0x2008),iVar5,
                     *(void **)(this + 0x4820));
          *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 0x10;
          uVar13 = *(ulong *)(this + 0x4810);
          if ((uVar13 & 0x1f) != 0) {
            uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar13 & 0x1f);
            uVar13 = (uVar13 - uVar8) + 0x20;
          }
          *(ulong *)(this + 0x4818) = *(long *)(this + 0x4818) + (bVar12 * uVar13 >> 3);
          if ((BVar7 != (BitpackingState<unsigned_int,int>)0x5 && uVar3 != 0) && bVar12 < bVar11) {
            return true;
          }
        }
      }
      if (this[0x4847] == (BitpackingState<unsigned_int,int>)0x1) {
        uVar3 = *(uint *)(this + 0x4830);
        iVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        bVar12 = 0x20;
        if (uVar3 < 0x10000000) {
          bVar12 = 0x20 - ((byte)iVar2 ^ 0x1f);
        }
        if (uVar3 == 0) {
          bVar12 = 0;
        }
        values_00 = *(uint **)(this + 0x2008);
        iVar5 = *(idx_t *)(this + 0x4810);
        if (iVar5 != 0) {
          iVar2 = *(int *)(this + 0x4828);
          iVar9 = 0;
          do {
            puVar1 = values_00 + iVar9;
            *puVar1 = *puVar1 - iVar2;
            iVar9 = iVar9 + 1;
          } while (iVar5 != iVar9);
        }
        BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteFor
                  (values_00,(bool *)(this + 0x4010),bVar12,*(uint *)(this + 0x4828),iVar5,
                   *(void **)(this + 0x4820));
        uVar13 = *(ulong *)(this + 0x4810);
        if ((uVar13 & 0x1f) != 0) {
          uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar13 & 0x1f);
          uVar13 = (uVar13 - uVar8) + 0x20;
        }
        *(ulong *)(this + 0x4818) = *(long *)(this + 0x4818) + (bVar12 * uVar13 >> 3) + 0xc;
      }
      else {
        bVar10 = false;
      }
    }
    else {
      BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteConstant
                (*(uint *)(this + 0x482c),*(idx_t *)(this + 0x4810),*(void **)(this + 0x4820),
                 (bool)this[0x4845]);
      *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 8;
    }
  }
  return bVar10;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}